

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CService::SetSockAddr(CService *this,sockaddr *paddr)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  ushort *in_RSI;
  CService *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff88;
  undefined1 local_59;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *in_RSI;
  uVar3 = (uint)uVar1;
  if (uVar3 == 2) {
    CService((CService *)(ulong)CONCAT24(uVar1,in_stack_ffffffffffffff88),(sockaddr_in *)in_RDI);
    operator=((CService *)CONCAT44(uVar3,in_stack_ffffffffffffff88),in_RDI);
    ~CService((CService *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    local_59 = true;
  }
  else if (uVar3 == 10) {
    CService((CService *)(ulong)CONCAT24(uVar1,in_stack_ffffffffffffff88),(sockaddr_in6 *)in_RDI);
    operator=((CService *)CONCAT44(uVar3,in_stack_ffffffffffffff88),in_RDI);
    ~CService((CService *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    local_59 = true;
  }
  else {
    local_59 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_59;
  }
  __stack_chk_fail();
}

Assistant:

bool CService::SetSockAddr(const struct sockaddr *paddr)
{
    switch (paddr->sa_family) {
    case AF_INET:
        *this = CService(*(const struct sockaddr_in*)paddr);
        return true;
    case AF_INET6:
        *this = CService(*(const struct sockaddr_in6*)paddr);
        return true;
    default:
        return false;
    }
}